

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  PyMethodDef *pPVar1;
  handle h;
  handle h_00;
  handle h_01;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *pcVar5;
  size_type sVar6;
  reference pvVar7;
  PyMethodDef *this_00;
  pointer pfVar8;
  PyObject **ppPVar9;
  ulong uVar10;
  long lVar11;
  long in_RCX;
  char *in_RDX;
  long *in_RDI;
  long in_R8;
  PyCFunctionObject *func;
  function_record *it;
  bool first_user_def;
  int index;
  string signatures;
  capsule rec_capsule_2;
  object scope_module;
  capsule rec_capsule_1;
  capsule rec_capsule;
  PyObject *self;
  function_record *chain_start;
  function_record *chain;
  string tname;
  handle th;
  type_info *tinfo;
  type_info *t;
  char c;
  char *pc;
  bool is_starred;
  size_t arg_index;
  size_t type_index;
  string signature;
  argument_record *a;
  iterator __end2;
  iterator __begin2;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range2;
  strdup_guard guarded_strdup;
  function_record *rec;
  PyTypeObject *in_stack_fffffffffffffa68;
  handle in_stack_fffffffffffffa70;
  undefined2 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7a;
  undefined1 in_stack_fffffffffffffa7b;
  undefined1 in_stack_fffffffffffffa7c;
  undefined1 in_stack_fffffffffffffa7d;
  undefined1 in_stack_fffffffffffffa7e;
  undefined1 in_stack_fffffffffffffa7f;
  PyMethodDef *in_stack_fffffffffffffa80;
  object_api<pybind11::handle> *in_stack_fffffffffffffa88;
  PyObject *pPVar12;
  strdup_guard *in_stack_fffffffffffffa90;
  undefined6 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9e;
  undefined1 in_stack_fffffffffffffa9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab8;
  string *in_stack_fffffffffffffad0;
  PyTypeObject *local_520;
  allocator *in_stack_fffffffffffffb00;
  type_index *this_01;
  bool local_4d1;
  string local_490 [32];
  string local_470 [32];
  pointer local_450;
  byte local_445;
  int local_444;
  string local_440 [32];
  handle local_420 [7];
  PyObject *local_3e8;
  PyObject *local_3b8;
  handle local_3b0;
  _lambda_void___1_ local_3a1;
  handle local_3a0;
  allocator local_391;
  string local_390 [96];
  handle local_330 [2];
  handle local_320;
  PyTypeObject *local_318;
  pointer local_310;
  pointer local_308;
  handle local_300;
  allocator local_2f1;
  string local_2f0 [64];
  string local_2b0 [64];
  string local_270 [32];
  string local_250 [32];
  string local_230 [64];
  string local_1f0 [64];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  handle local_150;
  type_index local_148;
  type_info *local_140;
  type_info *local_138;
  string local_130 [32];
  string local_110 [39];
  char local_e9;
  char *local_e8;
  byte local_d9;
  ulong local_d8;
  long local_d0;
  string local_c8 [32];
  undefined8 local_a8;
  string local_98 [32];
  reference local_78;
  argument_record *local_70;
  __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
  local_68;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_60;
  pointer local_30;
  long local_28;
  long local_20;
  char *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = std::
             unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
             ::get((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    *)in_stack_fffffffffffffa70.m_ptr);
  strdup_guard::strdup_guard((strdup_guard *)0x2abf51);
  pcVar5 = strdup_guard::operator()
                     ((strdup_guard *)in_stack_fffffffffffffa80,
                      (char *)CONCAT17(in_stack_fffffffffffffa7f,
                                       CONCAT16(in_stack_fffffffffffffa7e,
                                                CONCAT15(in_stack_fffffffffffffa7d,
                                                         CONCAT14(in_stack_fffffffffffffa7c,
                                                                  CONCAT13(in_stack_fffffffffffffa7b
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  in_stack_fffffffffffffa78)))))));
  local_30->name = pcVar5;
  if (local_30->doc != (char *)0x0) {
    pcVar5 = strdup_guard::operator()
                       ((strdup_guard *)in_stack_fffffffffffffa80,
                        (char *)CONCAT17(in_stack_fffffffffffffa7f,
                                         CONCAT16(in_stack_fffffffffffffa7e,
                                                  CONCAT15(in_stack_fffffffffffffa7d,
                                                           CONCAT14(in_stack_fffffffffffffa7c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))));
    local_30->doc = pcVar5;
  }
  local_60 = &local_30->args;
  local_68._M_current =
       (argument_record *)
       std::
       vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
       ::begin((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)in_stack_fffffffffffffa68);
  local_70 = (argument_record *)
             std::
             vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             ::end((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    *)in_stack_fffffffffffffa68);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                             *)in_stack_fffffffffffffa70.m_ptr,
                            (__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                             *)in_stack_fffffffffffffa68), bVar2) {
    local_78 = __gnu_cxx::
               __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
               ::operator*(&local_68);
    if (*(long *)local_78 != 0) {
      pcVar5 = strdup_guard::operator()
                         ((strdup_guard *)in_stack_fffffffffffffa80,
                          (char *)CONCAT17(in_stack_fffffffffffffa7f,
                                           CONCAT16(in_stack_fffffffffffffa7e,
                                                    CONCAT15(in_stack_fffffffffffffa7d,
                                                             CONCAT14(in_stack_fffffffffffffa7c,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))));
      *(char **)local_78 = pcVar5;
    }
    if (*(long *)(local_78 + 8) == 0) {
      bVar2 = pybind11::handle::operator_cast_to_bool((handle *)(local_78 + 0x10));
      if (bVar2) {
        local_a8 = *(undefined8 *)(local_78 + 0x10);
        h_01.m_ptr._6_1_ = in_stack_fffffffffffffa9e;
        h_01.m_ptr._0_6_ = in_stack_fffffffffffffa98;
        h_01.m_ptr._7_1_ = in_stack_fffffffffffffa9f;
        repr(h_01);
        object::cast<std::__cxx11::string>((object *)in_stack_fffffffffffffa68);
        std::__cxx11::string::c_str();
        pcVar5 = strdup_guard::operator()
                           ((strdup_guard *)in_stack_fffffffffffffa80,
                            (char *)CONCAT17(in_stack_fffffffffffffa7f,
                                             CONCAT16(in_stack_fffffffffffffa7e,
                                                      CONCAT15(in_stack_fffffffffffffa7d,
                                                               CONCAT14(in_stack_fffffffffffffa7c,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))));
        *(char **)(local_78 + 8) = pcVar5;
        std::__cxx11::string::~string(local_98);
        pybind11::str::~str((str *)0x2ac1c8);
      }
    }
    else {
      pcVar5 = strdup_guard::operator()
                         ((strdup_guard *)in_stack_fffffffffffffa80,
                          (char *)CONCAT17(in_stack_fffffffffffffa7f,
                                           CONCAT16(in_stack_fffffffffffffa7e,
                                                    CONCAT15(in_stack_fffffffffffffa7d,
                                                             CONCAT14(in_stack_fffffffffffffa7c,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))));
      *(char **)(local_78 + 8) = pcVar5;
    }
    __gnu_cxx::
    __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
    ::operator++(&local_68);
  }
  iVar4 = strcmp(local_30->name,"__init__");
  local_4d1 = true;
  if (iVar4 != 0) {
    iVar4 = strcmp(local_30->name,"__setstate__");
    local_4d1 = iVar4 == 0;
  }
  *(ushort *)&local_30->field_0x59 = *(ushort *)&local_30->field_0x59 & 0xfffe | (ushort)local_4d1;
  std::__cxx11::string::string(local_c8);
  local_d0 = 0;
  local_d8 = 0;
  local_d9 = 0;
  for (local_e8 = local_18; uVar10 = local_d8, *local_e8 != '\0'; local_e8 = local_e8 + 1) {
    local_e9 = *local_e8;
    if (local_e9 == '{') {
      local_d9 = local_e8[1] == '*';
      if (!(bool)local_d9) {
        if (((*(ushort *)&local_30->field_0x59 >> 6 & 1) == 0) && (local_d8 == local_30->nargs_pos))
        {
          std::__cxx11::string::operator+=(local_c8,"*, ");
        }
        uVar10 = local_d8;
        sVar6 = std::
                vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ::size(&local_30->args);
        if ((uVar10 < sVar6) &&
           (pvVar7 = std::
                     vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ::operator[](&local_30->args,local_d8), *(long *)pvVar7 != 0)) {
          pvVar7 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[](&local_30->args,local_d8);
          std::__cxx11::string::operator+=(local_c8,*(char **)pvVar7);
        }
        else if ((local_d8 == 0) && ((*(ushort *)&local_30->field_0x59 >> 4 & 1) != 0)) {
          std::__cxx11::string::operator+=(local_c8,"self");
        }
        else {
          std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffaa8);
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffa7f,
                                          CONCAT16(in_stack_fffffffffffffa7e,
                                                   CONCAT15(in_stack_fffffffffffffa7d,
                                                            CONCAT14(in_stack_fffffffffffffa7c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa70.m_ptr);
          std::__cxx11::string::operator+=(local_c8,local_110);
          std::__cxx11::string::~string(local_110);
          std::__cxx11::string::~string(local_130);
        }
        std::__cxx11::string::operator+=(local_c8,": ");
      }
    }
    else if (local_e9 == '}') {
      if ((((local_d9 & 1) == 0) &&
          (sVar6 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::size(&local_30->args), uVar10 < sVar6)) &&
         (pvVar7 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[](&local_30->args,local_d8), *(long *)(pvVar7 + 8) != 0)) {
        std::__cxx11::string::operator+=(local_c8," = ");
        pvVar7 = std::
                 vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ::operator[](&local_30->args,local_d8);
        std::__cxx11::string::operator+=(local_c8,*(char **)(pvVar7 + 8));
      }
      if ((local_30->nargs_pos_only != 0) && (local_d8 + 1 == (ulong)local_30->nargs_pos_only)) {
        std::__cxx11::string::operator+=(local_c8,", /");
      }
      if ((local_d9 & 1) == 0) {
        local_d8 = local_d8 + 1;
      }
    }
    else if (local_e9 == '%') {
      local_138 = *(type_info **)(local_20 + local_d0 * 8);
      if (local_138 == (type_info *)0x0) {
        local_d0 = local_d0 + 1;
        pybind11_fail((char *)in_stack_fffffffffffffa80);
      }
      this_01 = &local_148;
      local_d0 = local_d0 + 1;
      std::type_index::type_index(this_01,local_138);
      local_140 = pybind11::detail::get_type_info
                            (this_01,SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
      if (local_140 == (type_info *)0x0) {
        if (((*(ushort *)&local_30->field_0x59 >> 1 & 1) == 0) || (local_d8 != 0)) {
          pcVar5 = std::type_info::name(local_138);
          in_stack_fffffffffffffb00 = &local_2f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f0,pcVar5,in_stack_fffffffffffffb00);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
          pybind11::detail::clean_type_id(in_stack_fffffffffffffad0);
          std::__cxx11::string::operator+=(local_c8,local_2f0);
          std::__cxx11::string::~string(local_2f0);
        }
        else {
          pybind11::detail::object_api<pybind11::handle>::attr
                    (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
          pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                     CONCAT17(in_stack_fffffffffffffa7f,
                              CONCAT16(in_stack_fffffffffffffa7e,
                                       CONCAT15(in_stack_fffffffffffffa7d,
                                                CONCAT14(in_stack_fffffffffffffa7c,
                                                         CONCAT13(in_stack_fffffffffffffa7b,
                                                                  CONCAT12(in_stack_fffffffffffffa7a
                                                                           ,
                                                  in_stack_fffffffffffffa78)))))));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffa7f,
                                  CONCAT16(in_stack_fffffffffffffa7e,
                                           CONCAT15(in_stack_fffffffffffffa7d,
                                                    CONCAT14(in_stack_fffffffffffffa7c,
                                                             CONCAT13(in_stack_fffffffffffffa7b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  in_stack_fffffffffffffa78)))))),
                         (char *)in_stack_fffffffffffffa70.m_ptr);
          pybind11::detail::object_api<pybind11::handle>::attr
                    (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
          pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                     CONCAT17(in_stack_fffffffffffffa7f,
                              CONCAT16(in_stack_fffffffffffffa7e,
                                       CONCAT15(in_stack_fffffffffffffa7d,
                                                CONCAT14(in_stack_fffffffffffffa7c,
                                                         CONCAT13(in_stack_fffffffffffffa7b,
                                                                  CONCAT12(in_stack_fffffffffffffa7a
                                                                           ,
                                                  in_stack_fffffffffffffa78)))))));
          std::operator+(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
          std::__cxx11::string::operator+=(local_c8,local_230);
          std::__cxx11::string::~string(local_230);
          std::__cxx11::string::~string(local_2b0);
          pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                    ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2aca24);
          std::__cxx11::string::~string(local_250);
          std::__cxx11::string::~string(local_270);
          pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                    ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2aca4b);
        }
      }
      else {
        pybind11::handle::handle<_object_*,_0>(&local_150,(_object *)local_140->type);
        pybind11::detail::object_api<pybind11::handle>::attr
                  (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
        pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::
        cast<std::__cxx11::string>
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                   CONCAT17(in_stack_fffffffffffffa7f,
                            CONCAT16(in_stack_fffffffffffffa7e,
                                     CONCAT15(in_stack_fffffffffffffa7d,
                                              CONCAT14(in_stack_fffffffffffffa7c,
                                                       CONCAT13(in_stack_fffffffffffffa7b,
                                                                CONCAT12(in_stack_fffffffffffffa7a,
                                                                         in_stack_fffffffffffffa78))
                                                      )))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa7f,
                                CONCAT16(in_stack_fffffffffffffa7e,
                                         CONCAT15(in_stack_fffffffffffffa7d,
                                                  CONCAT14(in_stack_fffffffffffffa7c,
                                                           CONCAT13(in_stack_fffffffffffffa7b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  in_stack_fffffffffffffa78)))))),
                       (char *)in_stack_fffffffffffffa70.m_ptr);
        pybind11::detail::object_api<pybind11::handle>::attr
                  (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
        pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::
        cast<std::__cxx11::string>
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                   CONCAT17(in_stack_fffffffffffffa7f,
                            CONCAT16(in_stack_fffffffffffffa7e,
                                     CONCAT15(in_stack_fffffffffffffa7d,
                                              CONCAT14(in_stack_fffffffffffffa7c,
                                                       CONCAT13(in_stack_fffffffffffffa7b,
                                                                CONCAT12(in_stack_fffffffffffffa7a,
                                                                         in_stack_fffffffffffffa78))
                                                      )))));
        std::operator+(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
        std::__cxx11::string::operator+=(local_c8,local_170);
        std::__cxx11::string::~string(local_170);
        std::__cxx11::string::~string(local_1f0);
        pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2ac804);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::~string(local_1b0);
        pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2ac82b);
      }
    }
    else {
      std::__cxx11::string::operator+=(local_c8,local_e9);
    }
  }
  if ((local_d8 ==
       (local_28 - (ulong)((byte)(*(ushort *)&local_30->field_0x59 >> 6) & 1)) -
       (ulong)((byte)(*(ushort *)&local_30->field_0x59 >> 7) & 1)) &&
     (*(long *)(local_20 + local_d0 * 8) == 0)) {
    std::__cxx11::string::c_str();
    pcVar5 = strdup_guard::operator()
                       ((strdup_guard *)in_stack_fffffffffffffa80,
                        (char *)CONCAT17(in_stack_fffffffffffffa7f,
                                         CONCAT16(in_stack_fffffffffffffa7e,
                                                  CONCAT15(in_stack_fffffffffffffa7d,
                                                           CONCAT14(in_stack_fffffffffffffa7c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))));
    local_30->signature = pcVar5;
    std::
    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>::
    shrink_to_fit((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   *)0x2accfe);
    local_30->nargs = (uint16_t)local_28;
    bVar2 = pybind11::handle::operator_cast_to_bool(&local_30->sibling);
    if (bVar2) {
      ppPVar9 = pybind11::handle::ptr(&local_30->sibling);
      iVar4 = _Py_IS_TYPE(*ppPVar9,(PyTypeObject *)&PyInstanceMethod_Type);
      if (iVar4 != 0) {
        ppPVar9 = pybind11::handle::ptr(&local_30->sibling);
        pybind11::handle::handle<_object_*,_0>(&local_300,(_object *)(*ppPVar9)[1].ob_refcnt);
        (local_30->sibling).m_ptr = local_300.m_ptr;
      }
    }
    local_308 = (pointer)0x0;
    local_310 = local_30;
    bVar2 = pybind11::handle::operator_cast_to_bool(&local_30->sibling);
    if (bVar2) {
      pybind11::handle::ptr(&local_30->sibling);
      iVar4 = _PyObject_TypeCheck(in_stack_fffffffffffffa70.m_ptr,in_stack_fffffffffffffa68);
      if (iVar4 == 0) {
        bVar2 = pybind11::detail::object_api<pybind11::handle>::is_none
                          ((object_api<pybind11::handle> *)0x2acf9b);
        if ((!bVar2) && (*local_30->name != '_')) {
          pcVar5 = local_30->name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_390,pcVar5,&local_391);
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffa7f,
                                          CONCAT16(in_stack_fffffffffffffa7e,
                                                   CONCAT15(in_stack_fffffffffffffa7d,
                                                            CONCAT14(in_stack_fffffffffffffa7c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa70.m_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffa7f,
                                  CONCAT16(in_stack_fffffffffffffa7e,
                                           CONCAT15(in_stack_fffffffffffffa7d,
                                                    CONCAT14(in_stack_fffffffffffffa7c,
                                                             CONCAT13(in_stack_fffffffffffffa7b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  in_stack_fffffffffffffa78)))))),
                         (char *)in_stack_fffffffffffffa70.m_ptr);
          pybind11_fail((string *)in_stack_fffffffffffffa80);
        }
      }
      else {
        ppPVar9 = pybind11::handle::ptr(&local_30->sibling);
        if ((*(uint *)((*ppPVar9)[1].ob_refcnt + 0x10) & 0x20) == 0) {
          ppPVar9 = pybind11::handle::ptr(&local_30->sibling);
          local_520 = (*ppPVar9)[1].ob_type;
        }
        else {
          local_520 = (PyTypeObject *)0x0;
        }
        local_318 = local_520;
        pybind11::handle::handle<_object_*,_0>(&local_320,(_object *)local_520);
        bVar2 = isinstance<pybind11::capsule,_0>(in_stack_fffffffffffffa70);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          pybind11::handle::handle<_object_*,_0>(local_330,(_object *)local_318);
          h.m_ptr._2_1_ = in_stack_fffffffffffffa7a;
          h.m_ptr._0_2_ = in_stack_fffffffffffffa78;
          h.m_ptr._3_1_ = in_stack_fffffffffffffa7b;
          h.m_ptr._4_1_ = in_stack_fffffffffffffa7c;
          h.m_ptr._5_1_ = in_stack_fffffffffffffa7d;
          h.m_ptr._6_1_ = in_stack_fffffffffffffa7e;
          h.m_ptr._7_1_ = in_stack_fffffffffffffa7f;
          reinterpret_borrow<pybind11::capsule>(h);
          bVar2 = pybind11::detail::is_function_record_capsule
                            ((capsule *)in_stack_fffffffffffffa70.m_ptr);
          if (bVar2) {
            local_308 = capsule::get_pointer<pybind11::detail::function_record>
                                  ((capsule *)in_stack_fffffffffffffa90);
            bVar2 = pybind11::detail::object_api<pybind11::handle>::is
                              ((object_api<pybind11::handle> *)in_stack_fffffffffffffa70.m_ptr,
                               (object_api<pybind11::handle> *)in_stack_fffffffffffffa68);
            if (!bVar2) {
              local_308 = (pointer)0x0;
            }
          }
          else {
            local_308 = (pointer)0x0;
          }
          capsule::~capsule((capsule *)0x2acf85);
        }
        else {
          local_308 = (pointer)0x0;
        }
      }
    }
    if (local_308 == (pointer)0x0) {
      this_00 = (PyMethodDef *)operator_new(0x20);
      *(undefined8 *)&this_00->ml_flags = 0;
      this_00->ml_doc = (char *)0x0;
      this_00->ml_name = (char *)0x0;
      this_00->ml_meth = (PyCFunction)0x0;
      local_30->def = this_00;
      pPVar1 = local_30->def;
      *(undefined8 *)&pPVar1->ml_flags = 0;
      pPVar1->ml_doc = (char *)0x0;
      pPVar1->ml_name = (char *)0x0;
      pPVar1->ml_meth = (PyCFunction)0x0;
      local_30->def->ml_name = local_30->name;
      local_30->def->ml_meth = dispatcher;
      local_30->def->ml_flags = 3;
      pfVar8 = std::
               unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
               ::release((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                          *)0x2ad176);
      initialize_generic(std::unique_ptr&&,char_const*,std::type_info_const*const*,unsigned_long)::
      {lambda(void*)#1}::operator_cast_to_function_pointer(&local_3a1);
      capsule::capsule((capsule *)this_00,pfVar8,(_func_void_void_ptr *)in_stack_fffffffffffffaa0);
      pybind11::detail::get_function_record_capsule_name();
      capsule::set_name((capsule *)in_stack_fffffffffffffa80,
                        (char *)CONCAT17(in_stack_fffffffffffffa7f,
                                         CONCAT16(in_stack_fffffffffffffa7e,
                                                  CONCAT15(in_stack_fffffffffffffa7d,
                                                           CONCAT14(in_stack_fffffffffffffa7c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))));
      strdup_guard::release((strdup_guard *)0x2ad1cc);
      object::object((object *)0x2ad1db);
      bVar2 = pybind11::handle::operator_cast_to_bool(&local_30->scope);
      if (bVar2) {
        local_3b8 = (local_30->scope).m_ptr;
        bVar2 = hasattr(in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        if (bVar2) {
          pybind11::detail::object_api<pybind11::handle>::attr
                    (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
          pybind11::detail::accessor::operator_cast_to_object
                    ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                     CONCAT17(in_stack_fffffffffffffa7f,
                              CONCAT16(in_stack_fffffffffffffa7e,
                                       CONCAT15(in_stack_fffffffffffffa7d,
                                                CONCAT14(in_stack_fffffffffffffa7c,
                                                         CONCAT13(in_stack_fffffffffffffa7b,
                                                                  CONCAT12(in_stack_fffffffffffffa7a
                                                                           ,
                                                  in_stack_fffffffffffffa78)))))));
          object::operator=((object *)in_stack_fffffffffffffa80,
                            (object *)
                            CONCAT17(in_stack_fffffffffffffa7f,
                                     CONCAT16(in_stack_fffffffffffffa7e,
                                              CONCAT15(in_stack_fffffffffffffa7d,
                                                       CONCAT14(in_stack_fffffffffffffa7c,
                                                                CONCAT13(in_stack_fffffffffffffa7b,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  in_stack_fffffffffffffa78)))))));
          object::~object((object *)0x2ad28b);
          pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                    ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2ad298);
        }
        else {
          local_3e8 = (local_30->scope).m_ptr;
          bVar2 = hasattr(in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
          if (bVar2) {
            pybind11::detail::object_api<pybind11::handle>::attr
                      (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80);
            pybind11::detail::accessor::operator_cast_to_object
                      ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                       CONCAT17(in_stack_fffffffffffffa7f,
                                CONCAT16(in_stack_fffffffffffffa7e,
                                         CONCAT15(in_stack_fffffffffffffa7d,
                                                  CONCAT14(in_stack_fffffffffffffa7c,
                                                           CONCAT13(in_stack_fffffffffffffa7b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  in_stack_fffffffffffffa78)))))));
            object::operator=((object *)in_stack_fffffffffffffa80,
                              (object *)
                              CONCAT17(in_stack_fffffffffffffa7f,
                                       CONCAT16(in_stack_fffffffffffffa7e,
                                                CONCAT15(in_stack_fffffffffffffa7d,
                                                         CONCAT14(in_stack_fffffffffffffa7c,
                                                                  CONCAT13(in_stack_fffffffffffffa7b
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  in_stack_fffffffffffffa78)))))));
            object::~object((object *)0x2ad38b);
            pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                      ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2ad398);
          }
        }
      }
      in_stack_fffffffffffffa80 = local_30->def;
      ppPVar9 = pybind11::handle::ptr(&local_3a0);
      pPVar12 = *ppPVar9;
      ppPVar9 = pybind11::handle::ptr(&local_3b0);
      in_stack_fffffffffffffa90 =
           (strdup_guard *)PyCMethod_New(in_stack_fffffffffffffa80,pPVar12,*ppPVar9,0);
      *in_RDI = (long)in_stack_fffffffffffffa90;
      if (*in_RDI == 0) {
        pybind11_fail((char *)in_stack_fffffffffffffa80);
      }
      object::~object((object *)0x2ad445);
      capsule::~capsule((capsule *)0x2ad452);
    }
    else {
      ppPVar9 = pybind11::handle::ptr(&local_30->sibling);
      *in_RDI = (long)*ppPVar9;
      pybind11::handle::inc_ref((handle *)in_stack_fffffffffffffa70.m_ptr);
      if (((byte)(*(ushort *)&local_308->field_0x59 >> 4) & 1) !=
          ((byte)(*(ushort *)&local_30->field_0x59 >> 4) & 1)) {
        pybind11_fail((char *)in_stack_fffffffffffffa80);
      }
      if ((*(ushort *)&local_30->field_0x59 >> 8 & 1) == 0) {
        local_310 = local_308;
        for (; local_308->next != (function_record *)0x0; local_308 = local_308->next) {
        }
        pfVar8 = std::
                 unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 ::release((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                            *)0x2ad609);
        local_308->next = pfVar8;
        strdup_guard::release((strdup_guard *)0x2ad628);
      }
      else {
        local_310 = local_30;
        local_30->next = local_308;
        pybind11::handle::handle<_object_*,_0>(local_420,*(_object **)(*in_RDI + 0x18));
        h_00.m_ptr._2_1_ = in_stack_fffffffffffffa7a;
        h_00.m_ptr._0_2_ = in_stack_fffffffffffffa78;
        h_00.m_ptr._3_1_ = in_stack_fffffffffffffa7b;
        h_00.m_ptr._4_1_ = in_stack_fffffffffffffa7c;
        h_00.m_ptr._5_1_ = in_stack_fffffffffffffa7d;
        h_00.m_ptr._6_1_ = in_stack_fffffffffffffa7e;
        h_00.m_ptr._7_1_ = in_stack_fffffffffffffa7f;
        reinterpret_borrow<pybind11::capsule>(h_00);
        std::
        unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        ::release((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)0x2ad568);
        capsule::set_pointer
                  ((capsule *)in_stack_fffffffffffffa80,
                   (void *)CONCAT17(in_stack_fffffffffffffa7f,
                                    CONCAT16(in_stack_fffffffffffffa7e,
                                             CONCAT15(in_stack_fffffffffffffa7d,
                                                      CONCAT14(in_stack_fffffffffffffa7c,
                                                               CONCAT13(in_stack_fffffffffffffa7b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  in_stack_fffffffffffffa78)))))));
        strdup_guard::release((strdup_guard *)0x2ad587);
        capsule::~capsule((capsule *)0x2ad596);
      }
    }
    std::__cxx11::string::string(local_440);
    local_444 = 0;
    if ((local_308 != (pointer)0x0) &&
       (in_stack_fffffffffffffa7f = options::show_function_signatures(),
       (bool)in_stack_fffffffffffffa7f)) {
      std::__cxx11::string::operator+=(local_440,local_30->name);
      std::__cxx11::string::operator+=(local_440,"(*args, **kwargs)\n");
      std::__cxx11::string::operator+=(local_440,"Overloaded function.\n\n");
    }
    local_445 = 1;
    for (local_450 = local_310; local_450 != (pointer)0x0; local_450 = local_450->next) {
      uVar3 = options::show_function_signatures();
      if ((bool)uVar3) {
        if (0 < local_444) {
          std::__cxx11::string::operator+=(local_440,'\n');
        }
        if (local_308 != (pointer)0x0) {
          local_444 = local_444 + 1;
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffa7f,
                                  CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffa7d,
                                                          CONCAT14(in_stack_fffffffffffffa7c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           in_stack_fffffffffffffa78)))))),
                         (char *)in_stack_fffffffffffffa70.m_ptr);
          std::__cxx11::string::operator+=(local_440,local_470);
          std::__cxx11::string::~string(local_470);
          std::__cxx11::string::~string(local_490);
        }
        std::__cxx11::string::operator+=(local_440,local_30->name);
        std::__cxx11::string::operator+=(local_440,local_450->signature);
        std::__cxx11::string::operator+=(local_440,'\n');
      }
      if (((local_450->doc != (char *)0x0) && (*local_450->doc != '\0')) &&
         (in_stack_fffffffffffffa7d = options::show_user_defined_docstrings(),
         (bool)in_stack_fffffffffffffa7d)) {
        in_stack_fffffffffffffa7c = options::show_function_signatures();
        if (!(bool)in_stack_fffffffffffffa7c) {
          if ((local_445 & 1) == 0) {
            std::__cxx11::string::operator+=(local_440,'\n');
          }
          else {
            local_445 = 0;
          }
        }
        in_stack_fffffffffffffa7b = options::show_function_signatures();
        if ((bool)in_stack_fffffffffffffa7b) {
          std::__cxx11::string::operator+=(local_440,'\n');
        }
        std::__cxx11::string::operator+=(local_440,local_450->doc);
        in_stack_fffffffffffffa7a = options::show_function_signatures();
        if ((bool)in_stack_fffffffffffffa7a) {
          std::__cxx11::string::operator+=(local_440,'\n');
        }
      }
    }
    lVar11 = *in_RDI;
    free(*(void **)(*(long *)(lVar11 + 0x10) + 0x18));
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar5 = strdup(pcVar5);
    }
    else {
      pcVar5 = (char *)0x0;
    }
    *(char **)(*(long *)(lVar11 + 0x10) + 0x18) = pcVar5;
    if ((*(ushort *)&local_30->field_0x59 >> 4 & 1) != 0) {
      lVar11 = PyInstanceMethod_New(*in_RDI);
      *in_RDI = lVar11;
      if (*in_RDI == 0) {
        pybind11_fail((char *)in_stack_fffffffffffffa80);
      }
      _Py_DECREF((PyObject *)0x2ada21);
    }
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string(local_c8);
    strdup_guard::~strdup_guard(in_stack_fffffffffffffa90);
    return;
  }
  pybind11_fail((char *)in_stack_fffffffffffffa80);
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "."
                                 + th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                if (!isinstance<capsule>(self)) {
                    chain = nullptr;
                } else {
                    auto rec_capsule = reinterpret_borrow<capsule>(self);
                    if (detail::is_function_record_capsule(rec_capsule)) {
                        chain = rec_capsule.get_pointer<detail::function_record>();
                        /* Never append a method to an overload chain of a parent class;
                           instead, hide the parent's overloads in this case */
                        if (!chain->scope.is(rec->scope)) {
                            chain = nullptr;
                        }
                    } else {
                        chain = nullptr;
                    }
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            rec_capsule.set_name(detail::get_function_record_capsule_name());
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
                    "#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more "
                    "details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += '\n';
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += '\n';
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += '\n';
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }